

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

xmlRegRangePtr
xmlRegAtomAddRange(xmlRegParserCtxtPtr ctxt,xmlRegAtomPtr atom,int neg,xmlRegAtomType type,int start
                  ,int end,xmlChar *blockName)

{
  uint uVar1;
  int iVar2;
  xmlRegRangePtr *ppxVar3;
  xmlRegRangePtr pxVar4;
  uint uVar5;
  uint uVar6;
  char *extra;
  
  if (atom == (xmlRegAtomPtr)0x0) {
    ctxt->error = 0x5aa;
    extra = "add range: atom is NULL";
LAB_0017923a:
    xmlRegexpErrCompile(ctxt,extra);
    return (xmlRegRangePtr)0x0;
  }
  if (atom->type != XML_REGEXP_RANGES) {
    ctxt->error = 0x5aa;
    extra = "add range: atom is not ranges";
    goto LAB_0017923a;
  }
  uVar1 = atom->maxRanges;
  if ((int)uVar1 <= atom->nbRanges) {
    if ((int)uVar1 < 1) {
      uVar6 = 4;
    }
    else {
      if (999999999 < uVar1) goto LAB_001792b3;
      uVar5 = uVar1 + 1 >> 1;
      uVar6 = uVar5 + uVar1;
      if (1000000000 - uVar5 < uVar1) {
        uVar6 = 1000000000;
      }
    }
    ppxVar3 = (xmlRegRangePtr *)(*xmlRealloc)(atom->ranges,(ulong)uVar6 << 3);
    if (ppxVar3 == (xmlRegRangePtr *)0x0) {
LAB_001792b3:
      xmlRegexpErrMemory(ctxt);
      return (xmlRegRangePtr)0x0;
    }
    atom->ranges = ppxVar3;
    atom->maxRanges = uVar6;
  }
  pxVar4 = xmlRegNewRange(ctxt,neg,type,start,end);
  if (pxVar4 == (xmlRegRangePtr)0x0) {
    return (xmlRegRangePtr)0x0;
  }
  pxVar4->blockName = blockName;
  iVar2 = atom->nbRanges;
  atom->nbRanges = iVar2 + 1;
  atom->ranges[iVar2] = pxVar4;
  return pxVar4;
}

Assistant:

static xmlRegRangePtr
xmlRegAtomAddRange(xmlRegParserCtxtPtr ctxt, xmlRegAtomPtr atom,
	           int neg, xmlRegAtomType type, int start, int end,
		   xmlChar *blockName) {
    xmlRegRangePtr range;

    if (atom == NULL) {
	ERROR("add range: atom is NULL");
	return(NULL);
    }
    if (atom->type != XML_REGEXP_RANGES) {
	ERROR("add range: atom is not ranges");
	return(NULL);
    }
    if (atom->nbRanges >= atom->maxRanges) {
	xmlRegRangePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(atom->maxRanges, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    xmlRegexpErrMemory(ctxt);
	    return(NULL);
        }
	tmp = xmlRealloc(atom->ranges, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    return(NULL);
	}
	atom->ranges = tmp;
	atom->maxRanges = newSize;
    }
    range = xmlRegNewRange(ctxt, neg, type, start, end);
    if (range == NULL)
	return(NULL);
    range->blockName = blockName;
    atom->ranges[atom->nbRanges++] = range;

    return(range);
}